

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_type.h
# Opt level: O1

bool date::rfc1123::validate(parts *dt)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  byte bVar10;
  ushort uVar11;
  
  uVar3 = dt->year;
  if (uVar3 == 0) {
    return false;
  }
  bVar1 = dt->month;
  if ((byte)(bVar1 - 0xd) < 0xf4) {
    return false;
  }
  bVar2 = dt->day;
  if (bVar2 == 0) {
    return false;
  }
  uVar6 = (uint)uVar3;
  if (bVar1 < 0xc) {
    bVar10 = 0x1e;
    if ((0xa50U >> (bVar1 & 0x1f) & 1) != 0) goto LAB_0010780c;
    if (bVar1 == 2) {
      bVar10 = 0x1c;
      if ((uVar3 & 3) == 0) {
        bVar10 = 0x1d;
        if ((uVar6 * -0x3d70a3d7 >> 2 | uVar6 * 0x40000000) < 0x28f5c29) {
          bVar10 = (uVar6 * -0x3d70a3d7 >> 4 | uVar6 * -0x70000000) < 0xa3d70b | 0x1c;
        }
      }
      goto LAB_0010780c;
    }
  }
  bVar10 = 0x1f;
LAB_0010780c:
  bVar5 = false;
  if ((((bVar2 <= bVar10) && (dt->hour < 0x18)) && (dt->minute < 0x3c)) && (dt->second < 0x3c)) {
    uVar3 = dt->offset_in_minutes;
    uVar11 = -uVar3;
    if (0 < (short)uVar3) {
      uVar11 = uVar3;
    }
    if (0x1797 < uVar11) {
      return false;
    }
    if (dt->week_day != '\0') {
      uVar4 = bVar1 + 0xc;
      if (bVar1 >= 3) {
        uVar4 = (uint)bVar1;
      }
      iVar7 = uVar6 - (bVar1 < 3);
      iVar8 = iVar7 + 3;
      if (-1 < iVar7) {
        iVar8 = iVar7;
      }
      iVar9 = (int)((ulong)((long)iVar7 * -0x51eb851f) >> 0x20);
      iVar8 = iVar7 / 400 + ((iVar9 >> 5) - (iVar9 >> 0x1f)) + (iVar8 >> 2) + iVar7 * 0x16d +
              (int)(uVar4 * 0x99 + -0x1c9) / 5;
      iVar7 = iVar8 + (uint)bVar2;
      iVar8 = (int)((ulong)((long)(int)((uint)bVar2 + iVar8 + 1) * -0x6db6db6d) >> 0x20) + iVar7 + 1
      ;
      if (dt->week_day !=
          (week_day_type)(((char)(iVar8 >> 2) - (char)(iVar8 >> 0x1f)) * -7 + (char)iVar7 + '\x02'))
      {
        return false;
      }
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (std::abs(dt.offset_in_minutes) > 6039)
            return false;
        if (dt.week_day != 0)
        {
            const auto week_day = calendar_helper::day_of_week(calendar_helper::date{ dt.year, dt.month, dt.day });
            if (dt.week_day != week_day)
                return false;
        }
        return true;
    }